

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crit.hpp
# Opt level: O1

double calc_kurtosis_weighted<float,std::vector<double,std::allocator<double>>,long_double>
                 (size_t *ix_arr,size_t st,size_t end,float *x,MissingAction missing_action,
                 vector<double,_std::allocator<double>_> *w)

{
  bool bVar1;
  size_t sVar2;
  longdouble lVar3;
  longdouble lVar4;
  longdouble lVar5;
  longdouble lVar6;
  longdouble lVar7;
  longdouble local_80;
  longdouble local_74;
  long local_58;
  ushort uStack_50;
  ushort uStack_40;
  longdouble local_30;
  longdouble local_24;
  
  lVar5 = (longdouble)0;
  local_80 = lVar5;
  local_74 = lVar5;
  if (st <= end) {
    lVar5 = (longdouble)0;
    sVar2 = st;
    lVar3 = lVar5;
    local_80 = lVar5;
    local_74 = lVar5;
    local_30 = lVar5;
    local_24 = lVar5;
    do {
      lVar7 = lVar3;
      if ((uint)ABS(x[ix_arr[sVar2]]) < 0x7f800000) {
        lVar4 = (longdouble)
                (w->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_start[ix_arr[sVar2]];
        lVar7 = lVar5 + lVar4;
        lVar5 = (longdouble)x[ix_arr[sVar2]] - local_24;
        lVar6 = lVar5 / lVar7;
        lVar5 = lVar3 * lVar6 * lVar5;
        local_24 = lVar4 * lVar6 + local_24;
        local_74 = local_74 +
                   (lVar6 * (longdouble)-4.0 * local_30 +
                   lVar6 * lVar6 * (longdouble)6.0 * local_80 +
                   lVar5 * lVar6 * lVar6 *
                   (lVar7 * lVar7 + (longdouble)-3.0 * lVar7 + (longdouble)3.0)) * lVar4;
        local_30 = ((longdouble)-3.0 * lVar6 * local_80 + (lVar7 + (longdouble)-2.0) * lVar5 * lVar6
                   ) * lVar4 + local_30;
        local_80 = lVar5 * lVar4 + local_80;
        lVar5 = lVar7;
      }
      sVar2 = sVar2 + 1;
      lVar3 = lVar7;
    } while (sVar2 <= end);
  }
  if (((longdouble)0 < lVar5) &&
     ((uStack_40 = (ushort)((unkuint10)local_80 >> 0x40),
      (local_80 <= (longdouble)2.220446e-16 &
      (((unkuint10)local_80 & 0x7fff) == 0 |
      (ushort)((uStack_40 & 0x7fff) - 1) < 0x7ffe & (byte)((unkuint10)local_80 >> 0x38) >> 7)) != 1
      || (bVar1 = check_more_than_two_unique_values<float>(ix_arr,st,end,x,missing_action), bVar1)))
     ) {
    lVar5 = (local_74 / local_80) * (lVar5 / local_80);
    uStack_50 = (ushort)((unkuint10)lVar5 >> 0x40);
    local_58 = SUB108(lVar5,0);
    if (((unkuint10)lVar5 & 0x7fff) == 0 ||
        (ushort)((uStack_50 & 0x7fff) - 1) < 0x7ffe && local_58 < 0) {
      if (0.0 < (double)lVar5) {
        return (double)lVar5;
      }
      return 0.0;
    }
  }
  return -INFINITY;
}

Assistant:

double calc_kurtosis_weighted(size_t ix_arr[], size_t st, size_t end, real_t x[],
                              MissingAction missing_action, mapping &restrict w)
{
    ldouble_safe m = 0;
    ldouble_safe M2 = 0, M3 = 0, M4 = 0;
    ldouble_safe delta, delta_s, delta_div;
    ldouble_safe diff;
    ldouble_safe n = 0;
    ldouble_safe out;
    ldouble_safe n_prev = 0.;
    ldouble_safe w_this;

    for (size_t row = st; row <= end; row++)
    {
        if (likely(!is_na_or_inf(x[ix_arr[row]])))
        {
            w_this = w[ix_arr[row]];
            n += w_this;

            delta      =  x[ix_arr[row]] - m;
            delta_div  =  delta / n;
            delta_s    =  delta_div * delta_div;
            diff       =  delta * (delta_div * n_prev);
            n_prev     =  n;

            m   +=  w_this * (delta_div);
            M4  +=  w_this * (diff * delta_s * (n * n - 3 * n + 3) + 6 * delta_s * M2 - 4 * delta_div * M3);
            M3  +=  w_this * (diff * delta_div * (n - 2) - 3 * delta_div * M2);
            M2  +=  w_this * (diff);
        }
    }

    if (unlikely(n <= 0)) return -HUGE_VAL;
    if (unlikely(!is_na_or_inf(M2) && M2 <= std::numeric_limits<double>::epsilon()))
    {
        if (!check_more_than_two_unique_values(ix_arr, st, end, x, missing_action))
            return -HUGE_VAL;
    }

    out = ( M4 / M2 ) * ( n / M2 );
    return (!is_na_or_inf(out))? std::fmax((double)out, 0.) : (-HUGE_VAL);
}